

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_environment_createDefaultForSourceCodeEvaluation
          (sysbvm_context_t *context,sysbvm_tuple_t sourceCode)

{
  sysbvm_tuple_t environment;
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t sVar2;
  
  environment = sysbvm_environment_createDefaultForEvaluation(context);
  sVar1 = sysbvm_symbol_internWithCString(context,"__SourceDirectory__");
  sVar2 = sysbvm_sourceCode_getDirectory(sourceCode);
  sysbvm_environment_setNewSymbolBindingWithValueAtSourcePosition(context,environment,sVar1,sVar2,0)
  ;
  sVar1 = sysbvm_symbol_internWithCString(context,"__SourceName__");
  sVar2 = sysbvm_sourceCode_getName(sourceCode);
  sysbvm_environment_setNewSymbolBindingWithValueAtSourcePosition(context,environment,sVar1,sVar2,0)
  ;
  sVar1 = sysbvm_symbol_internWithCString(context,"__SourceLanguage__");
  sVar2 = sysbvm_sourceCode_getLanguage(sourceCode);
  sysbvm_environment_setNewSymbolBindingWithValueAtSourcePosition(context,environment,sVar1,sVar2,0)
  ;
  return environment;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_environment_createDefaultForSourceCodeEvaluation(sysbvm_context_t *context, sysbvm_tuple_t sourceCode)
{
    sysbvm_tuple_t environment = sysbvm_environment_createDefaultForEvaluation(context);
    sysbvm_environment_setNewSymbolBindingWithValue(context, environment, sysbvm_symbol_internWithCString(context, "__SourceDirectory__"), sysbvm_sourceCode_getDirectory(sourceCode));
    sysbvm_environment_setNewSymbolBindingWithValue(context, environment, sysbvm_symbol_internWithCString(context, "__SourceName__"), sysbvm_sourceCode_getName(sourceCode));
    sysbvm_environment_setNewSymbolBindingWithValue(context, environment, sysbvm_symbol_internWithCString(context, "__SourceLanguage__"), sysbvm_sourceCode_getLanguage(sourceCode));
    return environment;
}